

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AppendProperty
          (cmTarget *this,string *prop,string *value,optional<cmListFileBacktrace> *bt,bool asString
          )

{
  cmMakefile *pcVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  cmValue cVar6;
  undefined1 in_R9B;
  string_view str;
  string sStack_228;
  cmListFileBacktrace lfbt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = std::operator==(prop,"NAME");
  if (bVar3) {
    pcVar1 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lfbt,"NAME property is read-only\n",(allocator<char> *)&sStack_228);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&lfbt);
LAB_0028ecb2:
    std::__cxx11::string::~string((string *)&lfbt);
    return;
  }
  bVar3 = std::operator==(prop,"EXPORT_NAME");
  if ((bVar3) &&
     (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfbt);
    poVar5 = std::operator<<((ostream *)&lfbt,
                             "EXPORT_NAME property can\'t be set on imported targets (\"");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->Name);
    std::operator<<(poVar5,"\")\n");
    pcVar1 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&sStack_228);
  }
  else {
    bVar3 = std::operator==(prop,"SOURCES");
    if ((bVar3) &&
       (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == true))
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfbt);
      poVar5 = std::operator<<((ostream *)&lfbt,
                               "SOURCES property can\'t be set on imported targets (\"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->Name);
      std::operator<<(poVar5,"\")\n");
      pcVar1 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&sStack_228);
    }
    else {
      bVar3 = std::operator==(prop,"IMPORTED_GLOBAL");
      if (!bVar3) {
        bVar3 = std::operator==(prop,"INCLUDE_DIRECTORIES");
        if (bVar3) {
          if (value->_M_string_length == 0) {
            return;
          }
          cmTargetInternals::GetBacktrace
                    ((cmTargetInternals *)&lfbt,
                     (optional<cmListFileBacktrace> *)
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,value,&lfbt);
        }
        else {
          bVar3 = std::operator==(prop,"COMPILE_OPTIONS");
          if (bVar3) {
            if (value->_M_string_length == 0) {
              return;
            }
            cmTargetInternals::GetBacktrace
                      ((cmTargetInternals *)&lfbt,
                       (optional<cmListFileBacktrace> *)
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileOptionsEntries,value,&lfbt);
          }
          else {
            bVar3 = std::operator==(prop,"COMPILE_FEATURES");
            if (bVar3) {
              if (value->_M_string_length == 0) {
                return;
              }
              cmTargetInternals::GetBacktrace
                        ((cmTargetInternals *)&lfbt,
                         (optional<cmListFileBacktrace> *)
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)&((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             CompileFeaturesEntries,value,&lfbt);
            }
            else {
              bVar3 = std::operator==(prop,"COMPILE_DEFINITIONS");
              if (bVar3) {
                if (value->_M_string_length == 0) {
                  return;
                }
                cmTargetInternals::GetBacktrace
                          ((cmTargetInternals *)&lfbt,
                           (optional<cmListFileBacktrace> *)
                           (this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)&((this->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               CompileDefinitionsEntries,value,&lfbt);
              }
              else {
                bVar3 = std::operator==(prop,"LINK_OPTIONS");
                if (bVar3) {
                  if (value->_M_string_length == 0) {
                    return;
                  }
                  cmTargetInternals::GetBacktrace
                            ((cmTargetInternals *)&lfbt,
                             (optional<cmListFileBacktrace> *)
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 LinkOptionsEntries,value,&lfbt);
                }
                else {
                  bVar3 = std::operator==(prop,"LINK_DIRECTORIES");
                  if (bVar3) {
                    if (value->_M_string_length == 0) {
                      return;
                    }
                    cmTargetInternals::GetBacktrace
                              ((cmTargetInternals *)&lfbt,
                               (optional<cmListFileBacktrace> *)
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)&((this->impl)._M_t.
                                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                   ->LinkDirectoriesEntries,value,&lfbt);
                  }
                  else {
                    bVar3 = std::operator==(prop,"PRECOMPILE_HEADERS");
                    if (bVar3) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&lfbt,"PRECOMPILE_HEADERS_REUSE_FROM",
                                 (allocator<char> *)&sStack_228);
                      cVar6 = GetProperty(this,(string *)&lfbt);
                      std::__cxx11::string::~string((string *)&lfbt);
                      if (cVar6.Value != (string *)0x0) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfbt);
                        poVar5 = std::operator<<((ostream *)&lfbt,
                                                 "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target (\""
                                                );
                        poVar5 = std::operator<<(poVar5,(string *)
                                                        &((this->impl)._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>
                                                  ._M_head_impl)->Name);
                        std::operator<<(poVar5,"\")\n");
                        pcVar1 = ((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile;
                        std::__cxx11::stringbuf::str();
                        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&sStack_228);
                        goto LAB_0028ee31;
                      }
                      if (value->_M_string_length == 0) {
                        return;
                      }
                      cmTargetInternals::GetBacktrace
                                ((cmTargetInternals *)&lfbt,
                                 (optional<cmListFileBacktrace> *)
                                 (this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)&((this->impl)._M_t.
                                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                      .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                     _M_head_impl)->PrecompileHeadersEntries,value,&lfbt);
                    }
                    else {
                      bVar3 = std::operator==(prop,"LINK_LIBRARIES");
                      if (bVar3) {
                        if (value->_M_string_length == 0) {
                          return;
                        }
                        cmTargetInternals::GetBacktrace
                                  ((cmTargetInternals *)&lfbt,
                                   (optional<cmListFileBacktrace> *)
                                   (this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->LinkImplementationPropertyEntries,value,&lfbt)
                        ;
                      }
                      else {
                        _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
                        if (_Var4) {
                          if (value->_M_string_length == 0) {
                            return;
                          }
                          cmTargetInternals::GetBacktrace
                                    ((cmTargetInternals *)&lfbt,
                                     (optional<cmListFileBacktrace> *)
                                     (this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    );
                          std::
                          vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                      *)&((this->impl)._M_t.
                                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                          .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl)->LinkInterfacePropertyEntries,value,&lfbt);
                        }
                        else {
                          _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
                          if (_Var4) {
                            if (value->_M_string_length == 0) {
                              return;
                            }
                            cmTargetInternals::GetBacktrace
                                      ((cmTargetInternals *)&lfbt,
                                       (optional<cmListFileBacktrace> *)
                                       (this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl);
                            std::
                            vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        *)&((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->LinkInterfaceDirectPropertyEntries,value,
                                       &lfbt);
                          }
                          else {
                            _Var4 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                                                                        
                                                  propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_
                                                  );
                            if (_Var4) {
                              if (value->_M_string_length == 0) {
                                return;
                              }
                              cmTargetInternals::GetBacktrace
                                        ((cmTargetInternals *)&lfbt,
                                         (optional<cmListFileBacktrace> *)
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->
                                             LinkInterfaceDirectExcludePropertyEntries,value,&lfbt);
                            }
                            else {
                              bVar3 = std::operator==(prop,"SOURCES");
                              if (!bVar3) {
                                str._M_str = (prop->_M_dataplus)._M_p;
                                str._M_len = prop->_M_string_length;
                                bVar3 = cmHasLiteralPrefix<17ul>
                                                  (str,(char (*) [17])"IMPORTED_LIBNAME");
                                if (bVar3) {
                                  pcVar1 = ((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Makefile;
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&lfbt,prop," property may not be APPENDed.");
                                  cmMakefile::IssueMessage
                                            (pcVar1,FATAL_ERROR,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&lfbt);
                                }
                                else {
                                  bVar3 = std::operator==(prop,"C_STANDARD");
                                  if ((((!bVar3) &&
                                       (bVar3 = std::operator==(prop,"CXX_STANDARD"), !bVar3)) &&
                                      (bVar3 = std::operator==(prop,"CUDA_STANDARD"), !bVar3)) &&
                                     (((bVar3 = std::operator==(prop,"HIP_STANDARD"), !bVar3 &&
                                       (bVar3 = std::operator==(prop,"OBJC_STANDARD"), !bVar3)) &&
                                      (bVar3 = std::operator==(prop,"OBJCXX_STANDARD"), !bVar3)))) {
                                    _Var2._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    std::__cxx11::string::string
                                              ((string *)&local_50,(string *)value);
                                    bVar3 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var2._M_head_impl)->HeadersFileSets,this,
                                                       _Var2._M_head_impl,prop,&local_50,
                                                       (bool)in_R9B);
                                    std::__cxx11::string::~string((string *)&local_50);
                                    if (bVar3) {
                                      return;
                                    }
                                    _Var2._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    std::__cxx11::string::string
                                              ((string *)&local_70,(string *)value);
                                    bVar3 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var2._M_head_impl)->CxxModulesFileSets,
                                                       this,_Var2._M_head_impl,prop,&local_70,
                                                       (bool)in_R9B);
                                    std::__cxx11::string::~string((string *)&local_70);
                                    if (bVar3) {
                                      return;
                                    }
                                    _Var2._M_head_impl =
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl;
                                    std::__cxx11::string::string
                                              ((string *)&local_90,(string *)value);
                                    bVar3 = (anonymous_namespace)::FileSetType::
                                            WriteProperties<std::__cxx11::string>
                                                      ((FileSetType *)
                                                       &(_Var2._M_head_impl)->
                                                        CxxModuleHeadersFileSets,this,
                                                       _Var2._M_head_impl,prop,&local_90,
                                                       (bool)in_R9B);
                                    std::__cxx11::string::~string((string *)&local_90);
                                    if (bVar3) {
                                      return;
                                    }
                                    cmPropertyMap::AppendProperty
                                              (&((this->impl)._M_t.
                                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                                _M_head_impl)->Properties,prop,value,asString);
                                    return;
                                  }
                                  pcVar1 = ((this->impl)._M_t.
                                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                            .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                           _M_head_impl)->Makefile;
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&lfbt,prop," property may not be appended.");
                                  cmMakefile::IssueMessage
                                            (pcVar1,FATAL_ERROR,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&lfbt);
                                }
                                goto LAB_0028ecb2;
                              }
                              cmTargetInternals::GetBacktrace
                                        ((cmTargetInternals *)&lfbt,
                                         (optional<cmListFileBacktrace> *)
                                         (this->impl)._M_t.
                                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                         .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                         _M_head_impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->SourceEntries,value,&lfbt);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&lfbt);
      poVar5 = std::operator<<((ostream *)&lfbt,
                               "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\""
                              );
      poVar5 = std::operator<<(poVar5,(string *)
                                      &((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->Name);
      std::operator<<(poVar5,"\")\n");
      pcVar1 = ((this->impl)._M_t.
                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&sStack_228);
    }
  }
LAB_0028ee31:
  std::__cxx11::string::~string((string *)&sStack_228);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lfbt);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop,
                              const std::string& value,
                              cm::optional<cmListFileBacktrace> const& bt,
                              bool asString)
{
  if (prop == "NAME") {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "PRECOMPILE_HEADERS") {
    if (this->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS_REUSE_FROM property is already set on target "
           "(\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    if (!value.empty()) {
      cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->impl->GetBacktrace(bt);
    this->impl->SourceEntries.emplace_back(value, lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be APPENDed.");
  } else if (prop == "C_STANDARD" || prop == "CXX_STANDARD" ||
             prop == "CUDA_STANDARD" || prop == "HIP_STANDARD" ||
             prop == "OBJC_STANDARD" || prop == "OBJCXX_STANDARD") {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR, prop + " property may not be appended.");
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value,
               false)) { // NOLINT(bugprone-branch-clone)
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, false)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.AppendProperty(prop, value, asString);
  }
}